

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Compaction::AddInputDeletions(Compaction *this,VersionEdit *edit)

{
  int iVar1;
  size_type sVar2;
  reference ppFVar3;
  ulong local_28;
  size_t i;
  int which;
  VersionEdit *edit_local;
  Compaction *this_local;
  
  for (i._4_4_ = 0; i._4_4_ < 2; i._4_4_ = i._4_4_ + 1) {
    local_28 = 0;
    while( true ) {
      sVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                        (this->inputs_ + i._4_4_);
      if (sVar2 <= local_28) break;
      iVar1 = this->level_;
      ppFVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](this->inputs_ + i._4_4_,local_28);
      VersionEdit::RemoveFile(edit,iVar1 + i._4_4_,(*ppFVar3)->number);
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

void Compaction::AddInputDeletions(VersionEdit* edit) {
  for (int which = 0; which < 2; which++) {
    for (size_t i = 0; i < inputs_[which].size(); i++) {
      edit->RemoveFile(level_ + which, inputs_[which][i]->number);
    }
  }
}